

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_unrolled_unary_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t operand,char *op)

{
  bool forwarding;
  SPIRType *type;
  uint index;
  string expr;
  string local_50;
  
  type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  type_to_glsl_constructor_abi_cxx11_(&expr,this,type);
  ::std::__cxx11::string::push_back((char)&expr);
  index = 0;
  while (index < type->vecsize) {
    ::std::__cxx11::string::append((char *)&expr);
    to_extract_component_expression_abi_cxx11_(&local_50,this,operand,index);
    ::std::__cxx11::string::append((string *)&expr);
    ::std::__cxx11::string::~string((string *)&local_50);
    index = index + 1;
    if (index < type->vecsize) {
      ::std::__cxx11::string::append((char *)&expr);
    }
  }
  ::std::__cxx11::string::push_back((char)&expr);
  forwarding = should_forward(this,operand);
  emit_op(this,result_type,result_id,&expr,forwarding,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,operand);
  ::std::__cxx11::string::~string((string *)&expr);
  return;
}

Assistant:

void CompilerGLSL::emit_unrolled_unary_op(uint32_t result_type, uint32_t result_id, uint32_t operand, const char *op)
{
	auto &type = get<SPIRType>(result_type);
	auto expr = type_to_glsl_constructor(type);
	expr += '(';
	for (uint32_t i = 0; i < type.vecsize; i++)
	{
		// Make sure to call to_expression multiple times to ensure
		// that these expressions are properly flushed to temporaries if needed.
		expr += op;
		expr += to_extract_component_expression(operand, i);

		if (i + 1 < type.vecsize)
			expr += ", ";
	}
	expr += ')';
	emit_op(result_type, result_id, expr, should_forward(operand));

	inherit_expression_dependencies(result_id, operand);
}